

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fixed_size_buffer.cpp
# Opt level: O2

uint32_t __thiscall
duckdb::FixedSizeBuffer::GetOffset
          (FixedSizeBuffer *this,idx_t bitmask_count,idx_t available_segments)

{
  InternalException *this_00;
  idx_t iVar1;
  ulong uVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  idx_t i;
  long lVar6;
  allocator local_61;
  ValidityMask mask;
  string local_40;
  
  mask.super_TemplatedValidityMask<unsigned_long>.validity_mask = (unsigned_long *)Get(this,true);
  mask.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  mask.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  uVar5 = this->segment_count;
  mask.super_TemplatedValidityMask<unsigned_long>.capacity = available_segments;
  if ((mask.super_TemplatedValidityMask<unsigned_long>.validity_mask == (unsigned_long *)0x0) ||
     ((mask.super_TemplatedValidityMask<unsigned_long>.validity_mask[uVar5 >> 6] >> (uVar5 & 0x3f) &
      1) != 0)) {
    TemplatedValidityMask<unsigned_long>::SetInvalid
              (&mask.super_TemplatedValidityMask<unsigned_long>,uVar5);
    iVar1 = this->segment_count;
  }
  else {
    lVar3 = 0;
    iVar1 = 0;
    while( true ) {
      if (bitmask_count == iVar1) {
        this_00 = (InternalException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&local_40,"Invalid bitmask for FixedSizeAllocator",&local_61);
        InternalException::InternalException(this_00,&local_40);
        __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
      }
      if (mask.super_TemplatedValidityMask<unsigned_long>.validity_mask[iVar1] != 0) break;
      iVar1 = iVar1 + 1;
      lVar3 = lVar3 + -0x40;
    }
    lVar4 = 0;
    uVar5 = mask.super_TemplatedValidityMask<unsigned_long>.validity_mask[iVar1];
    for (lVar6 = 0; lVar6 != 6; lVar6 = lVar6 + 1) {
      uVar2 = (&BASE)[lVar6] & uVar5;
      if (uVar2 == 0) {
        uVar2 = uVar5 >> (*(byte *)((long)&SHIFT + lVar6) & 0x3f);
        lVar4 = lVar4 + (ulong)*(byte *)((long)&SHIFT + lVar6);
      }
      uVar5 = uVar2;
    }
    iVar1 = lVar4 - lVar3;
    TemplatedValidityMask<unsigned_long>::SetInvalid
              (&mask.super_TemplatedValidityMask<unsigned_long>,iVar1);
  }
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&mask.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  return (uint32_t)iVar1;
}

Assistant:

uint32_t FixedSizeBuffer::GetOffset(const idx_t bitmask_count, const idx_t available_segments) {

	// get the bitmask data
	auto bitmask_ptr = reinterpret_cast<validity_t *>(Get());
	ValidityMask mask(bitmask_ptr, available_segments);
	auto data = mask.GetData();

	// fills up a buffer sequentially before searching for free bits
	if (mask.RowIsValid(segment_count)) {
		mask.SetInvalid(segment_count);
		return UnsafeNumericCast<uint32_t>(segment_count);
	}

	for (idx_t entry_idx = 0; entry_idx < bitmask_count; entry_idx++) {
		// get an entry with free bits
		if (data[entry_idx] == 0) {
			continue;
		}

		// find the position of the free bit
		auto entry = data[entry_idx];
		idx_t first_valid_bit = 0;

		// this loop finds the position of the rightmost set bit in entry and stores it
		// in first_valid_bit
		for (idx_t i = 0; i < 6; i++) {
			// set the left half of the bits of this level to zero and test if the entry is still not zero
			if (entry & BASE[i]) {
				// first valid bit is in the rightmost s[i] bits
				// permanently set the left half of the bits to zero
				entry &= BASE[i];
			} else {
				// first valid bit is in the leftmost s[i] bits
				// shift by s[i] for the next iteration and add s[i] to the position of the rightmost set bit
				entry >>= SHIFT[i];
				first_valid_bit += SHIFT[i];
			}
		}
		D_ASSERT(entry);

		auto prev_bits = entry_idx * sizeof(validity_t) * 8;
		D_ASSERT(mask.RowIsValid(prev_bits + first_valid_bit));
		mask.SetInvalid(prev_bits + first_valid_bit);
		return UnsafeNumericCast<uint32_t>(prev_bits + first_valid_bit);
	}

	throw InternalException("Invalid bitmask for FixedSizeAllocator");
}